

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strarr.h
# Opt level: O0

void __thiscall
StrArr::StrArr(StrArr *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *strings)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  type ppcVar4;
  char *__s;
  char **__i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  size_type *in_RDI;
  size_t i;
  char **in_stack_ffffffffffffffa8;
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> *in_stack_ffffffffffffffb0;
  ulong local_28;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  *in_RDI = sVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *in_RDI + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  operator_new__(uVar3);
  std::unique_ptr<char*[],std::default_delete<char*[]>>::
  unique_ptr<char**,std::default_delete<char*[]>,void,bool>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ppcVar4 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                      (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  *ppcVar4 = (char *)0x0;
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (sVar2 <= local_28) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RSI,local_28);
    __s = (char *)std::__cxx11::string::c_str();
    __i = (char **)strdup(__s);
    in_stack_ffffffffffffffb0 =
         (unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)
         std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                   (in_stack_ffffffffffffffb0,(size_t)__i);
    (in_stack_ffffffffffffffb0->_M_t).super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>.
    _M_t.super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
    super__Head_base<0UL,_char_**,_false>._M_head_impl = __i;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

explicit StrArr(const std::vector<std::string>& strings)
      : size_(strings.size()), array_(new char*[size_ + 1]) {
    array_[size_] = NULL;
    for (size_t i = 0; i < strings.size(); i++) {
      // Can't use c_str() directly because array_ is not const char*.
      array_[i] = strdup(strings[i].c_str());
    }
  }

  ~StrArr() {
    // unique_ptr frees the array of pointers but not the pointed-to strings.
    for (int i = 0; i < size_; i++) {
      free(array_[i]);
    }
  }